

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O0

void __thiscall
jrtplib::RTCPCompoundPacketBuilder::ClearBuildBuffers(RTCPCompoundPacketBuilder *this)

{
  uint8_t *puVar1;
  bool bVar2;
  reference pBVar3;
  RTPMemoryManager *pRVar4;
  iterator local_60;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer> local_58;
  iterator local_50;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer> local_48;
  _List_node_base *local_40;
  iterator local_38;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer> local_30;
  iterator local_28;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer> local_20;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer> local_18;
  const_iterator it;
  RTCPCompoundPacketBuilder *this_local;
  
  it._M_node = (_List_node_base *)this;
  Report::Clear(&this->report);
  SDES::Clear(&this->sdes);
  std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::_List_const_iterator
            (&local_18);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
       ::begin(&this->byepackets);
  std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::_List_const_iterator
            (&local_20,&local_28);
  local_18._M_node = local_20._M_node;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
         ::end(&this->byepackets);
    std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::_List_const_iterator
              (&local_30,&local_38);
    bVar2 = std::operator!=(&local_18,&local_30);
    if (!bVar2) break;
    pBVar3 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::operator*
                       (&local_18);
    if (pBVar3->packetdata != (uint8_t *)0x0) {
      pBVar3 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::operator*
                         (&local_18);
      puVar1 = pBVar3->packetdata;
      pRVar4 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
      RTPDeleteByteArray(puVar1,pRVar4);
    }
    local_40 = (_List_node_base *)
               std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::operator++
                         (&local_18,0);
  }
  local_50._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
       ::begin(&this->apppackets);
  std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::_List_const_iterator
            (&local_48,&local_50);
  local_18._M_node = local_48._M_node;
  while( true ) {
    local_60._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
         ::end(&this->apppackets);
    std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::_List_const_iterator
              (&local_58,&local_60);
    bVar2 = std::operator!=(&local_18,&local_58);
    if (!bVar2) break;
    pBVar3 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::operator*
                       (&local_18);
    if (pBVar3->packetdata != (uint8_t *)0x0) {
      pBVar3 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::operator*
                         (&local_18);
      puVar1 = pBVar3->packetdata;
      pRVar4 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
      RTPDeleteByteArray(puVar1,pRVar4);
    }
    std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::operator++(&local_18,0);
  }
  std::__cxx11::
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ::clear(&this->byepackets);
  std::__cxx11::
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ::clear(&this->apppackets);
  this->byesize = 0;
  this->appsize = 0;
  return;
}

Assistant:

void RTCPCompoundPacketBuilder::ClearBuildBuffers()
{
	report.Clear();
	sdes.Clear();

	std::list<Buffer>::const_iterator it;
	for (it = byepackets.begin() ; it != byepackets.end() ; it++)
	{
		if ((*it).packetdata)
			RTPDeleteByteArray((*it).packetdata,GetMemoryManager());
	}
	for (it = apppackets.begin() ; it != apppackets.end() ; it++)
	{
		if ((*it).packetdata)
			RTPDeleteByteArray((*it).packetdata,GetMemoryManager());
	}
#ifdef RTP_SUPPORT_RTCPUNKNOWN
	for (it = unknownpackets.begin() ; it != unknownpackets.end() ; it++)
	{
		if ((*it).packetdata)
			RTPDeleteByteArray((*it).packetdata,GetMemoryManager());
	}
#endif // RTP_SUPPORT_RTCPUNKNOWN 

	byepackets.clear();
	apppackets.clear();
#ifdef RTP_SUPPORT_RTCPUNKNOWN
	unknownpackets.clear();
#endif // RTP_SUPPORT_RTCPUNKNOWN 
	byesize = 0;
	appsize = 0;
#ifdef RTP_SUPPORT_RTCPUNKNOWN
	unknownsize = 0;
#endif // RTP_SUPPORT_RTCPUNKNOWN 
}